

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

void Ivy_ManHaigStop(Ivy_Man_t *p)

{
  void *pvVar1;
  int i;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    Vec_IntFree((Vec_Int_t *)p->pHaig->pData);
    Ivy_ManStop(p->pHaig);
    p->pHaig = (Ivy_Man_t *)0x0;
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,i);
      if (pvVar1 != (void *)0x0) {
        *(undefined8 *)((long)pvVar1 + 0x48) = 0;
      }
    }
    return;
  }
  __assert_fail("p->pHaig != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                ,0xa3,"void Ivy_ManHaigStop(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManHaigStop( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig != NULL );
    Vec_IntFree( (Vec_Int_t *)p->pHaig->pData );
    Ivy_ManStop( p->pHaig );
    p->pHaig = NULL;
    // remove dangling pointers to the HAIG objects
    Ivy_ManForEachObj( p, pObj, i )
        pObj->pEquiv = NULL;
}